

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_putters.c
# Opt level: O2

int qc_putterschain_remove(QcPuttersChain *putterChain,QcPutter *putter)

{
  int iVar1;
  
  if ((putterChain != (QcPuttersChain *)0x0) && (putter != (QcPutter *)0x0)) {
    qc_thread_wrlock_lock(putterChain->rwlock);
    if (putter->_entry == (QcListEntry *)0x0) {
      iVar1 = -1;
    }
    else {
      iVar1 = qc_list_removeentry(putterChain->putBuckets[(long)putter->priority + -1]->puttersChain
                                  ,putter->_entry);
      if (iVar1 != 0) {
        fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_mq/qc_putters.c"
                ,0x134);
        __assert_fail("ret == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_mq/qc_putters.c"
                      ,0x134,"int qc_putterschain_remove(QcPuttersChain *, QcPutter *)");
      }
      putterChain->putter_count = putterChain->putter_count + -1;
      iVar1 = 0;
    }
    qc_thread_wrlock_unlock(putterChain->rwlock);
    return iVar1;
  }
  fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_mq/qc_putters.c"
          ,0x12a);
  __assert_fail("((void*)0) != putterChain && ((void*)0) != putter",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_mq/qc_putters.c"
                ,0x12a,"int qc_putterschain_remove(QcPuttersChain *, QcPutter *)");
}

Assistant:

int qc_putterschain_remove(QcPuttersChain *putterChain, QcPutter *putter) {
	qc_assert(NULL != putterChain && NULL != putter);

	qc_thread_wrlock_lock(putterChain->rwlock);
	int bucket_sn = putter->priority - 1;

	if(putter->_entry == NULL){  //null if putter is popped
		qc_thread_wrlock_unlock(putterChain->rwlock);
		return -1;
	}
	int ret = qc_list_removeentry(putterChain->putBuckets[bucket_sn]->puttersChain, putter->_entry);
	qc_assert(ret == 0);

	putterChain->putter_count--;
	qc_thread_wrlock_unlock(putterChain->rwlock);
	return 0;
}